

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::AdaptiveKdTree::split_kd_node
          (AdaptiveKdTree *this,index_t b,index_t e,double *bbox_min,double *bbox_max,index_t *m,
          coord_index_t *cut_dim,double *cut_val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint local_50;
  uint local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  uVar1 = (ulong)b;
  uVar3 = (ulong)(byte)(this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc;
  if (uVar3 == 0) {
    dVar5 = -0.999;
  }
  else {
    uVar2 = 0;
    dVar6 = -1.0;
    do {
      dVar5 = bbox_max[uVar2] - bbox_min[uVar2];
      if (bbox_max[uVar2] - bbox_min[uVar2] <= dVar6) {
        dVar5 = dVar6;
      }
      uVar2 = uVar2 + 1;
      dVar6 = dVar5;
    } while (uVar3 != uVar2);
    dVar5 = dVar5 * 0.999;
  }
  *cut_dim = '\0';
  if ((this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc != '\0') {
    dVar6 = -1.0;
    uVar3 = 0;
    do {
      if (dVar5 <= bbox_max[uVar3] - bbox_min[uVar3]) {
        dVar7 = -INFINITY;
        if (b < e) {
          uVar2 = uVar1;
          dVar8 = -1.79769313486232e+308;
          dVar9 = 1.79769313486232e+308;
          do {
            dVar7 = (this->super_KdTree).super_NearestNeighborSearch.points_
                    [uVar3 + (this->super_KdTree).point_index_.
                             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             .
                             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar2] *
                             (this->super_KdTree).super_NearestNeighborSearch.stride_];
            dVar10 = dVar7;
            if (dVar9 <= dVar7) {
              dVar10 = dVar9;
            }
            if (dVar7 <= dVar8) {
              dVar7 = dVar8;
            }
            uVar2 = uVar2 + 1;
            dVar8 = dVar7;
            dVar9 = dVar10;
          } while (e != uVar2);
          dVar7 = dVar7 - dVar10;
        }
        if (dVar6 < dVar7) {
          *cut_dim = (coord_index_t)uVar3;
          dVar6 = dVar7;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (byte)(this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc)
    ;
  }
  uVar3 = (ulong)((uint)*cut_dim * 8);
  local_38 = (*(double *)((long)bbox_min + uVar3) + *(double *)((long)bbox_max + uVar3)) * 0.5;
  if (e < b || e - b == 0) {
    local_48 = -1.79769313486232e+308;
    local_40 = 1.79769313486232e+308;
  }
  else {
    local_48 = -1.79769313486232e+308;
    local_40 = 1.79769313486232e+308;
    uVar3 = uVar1;
    do {
      dVar5 = (this->super_KdTree).super_NearestNeighborSearch.points_
              [(ulong)*cut_dim +
               (ulong)((this->super_KdTree).point_index_.
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       .
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar3] *
                      (this->super_KdTree).super_NearestNeighborSearch.stride_)];
      dVar6 = dVar5;
      if (local_40 <= dVar5) {
        dVar6 = local_40;
      }
      local_40 = dVar6;
      if (dVar5 <= local_48) {
        dVar5 = local_48;
      }
      local_48 = dVar5;
      uVar3 = uVar3 + 1;
    } while (e != uVar3);
  }
  *cut_val = local_38;
  dVar5 = local_40;
  if ((local_38 < local_40) || (dVar5 = local_48, local_48 < local_38)) {
    *cut_val = dVar5;
  }
  (*(this->super_KdTree).super_NearestNeighborSearch.super_Counted._vptr_Counted[0xf])
            (*cut_val,this,uVar1,(ulong)e,(ulong)*cut_dim,&local_4c,&local_50);
  uVar4 = (e - b >> 1) + b;
  *m = uVar4;
  if (local_40 <= local_38) {
    if (local_38 <= local_48) {
      if ((local_4c <= uVar4) && (local_4c = local_50, uVar4 <= local_50)) {
        return;
      }
    }
    else {
      local_4c = e - 1;
    }
  }
  else {
    local_4c = b + 1;
  }
  *m = local_4c;
  return;
}

Assistant:

void AdaptiveKdTree::split_kd_node(
        index_t b, index_t e,
	double* bbox_min, double* bbox_max,
	index_t& m, coord_index_t& cut_dim, double& cut_val	
    ) {
	// Like "sliding midpoint split" in ANN.
	
	const double ERR=0.001;
	
	// Find length of longest box size
	double max_length = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    max_length = std::max(max_length, length);
	}

	// Cutting coordinate
	cut_dim=0;
	
	// Find long side with most spread
	double max_spread = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    // Is it among longest ?
	    if(length >= (1.0 - ERR)*max_length) {
		double spr = spread(b, e, d);
		if(spr > max_spread) {
		    max_spread = spr;
		    cut_dim = d;
		}
	    }
	}

	double ideal_cut_val = 0.5*(bbox_min[cut_dim] + bbox_max[cut_dim]);

	double coord_min, coord_max;
	get_minmax(b, e, cut_dim, coord_min, coord_max);

	cut_val = ideal_cut_val;
	
	// Make it slide if need be.
	if(ideal_cut_val < coord_min) {
	    cut_val = coord_min;
	} else if (ideal_cut_val > coord_max) {
	    cut_val = coord_max;
	}
	
	index_t br1,br2;
	plane_split(b,e,cut_dim,cut_val,br1,br2);

	index_t m0 = b + (e-b)/2;
	m = m0;
	
	if(ideal_cut_val < coord_min) {
	    m = b+1;
	} else if(ideal_cut_val > coord_max) {
	    m = e-1;
	} else if(br1 > m0) {
	    m = br1;
	} else if(br2 < m0) {
	    m = br2;
	} 
    }